

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O2

compile_errcode __thiscall InputStatement::Action(InputStatement *this)

{
  int line_number;
  int character_number;
  pointer pSVar1;
  SymbolName SVar2;
  undefined4 uVar3;
  string identifier_name;
  
  uVar3 = 0;
  do {
    SVar2 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(uVar3) {
    case 0:
      uVar3 = 1;
      if (SVar2 != SCANF_SYM) {
        return -1;
      }
      break;
    case 1:
      uVar3 = 2;
      if (SVar2 != L_CIRCLE_BRACKET_SYM) {
        return -1;
      }
      break;
    case 2:
      if (SVar2 != IDENTIFIER_SYM) {
        return -1;
      }
      pSVar1 = (handle_correct_queue->m_symbol_queue).
               super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
               _M_start;
      line_number = pSVar1[handle_correct_queue->m_current_locate].m_line_number;
      character_number = pSVar1[handle_correct_queue->m_current_locate].m_character_number;
      SymbolQueue::GetCurrentValue<std::__cxx11::string>(&identifier_name,handle_correct_queue);
      IdentifierCheck(&identifier_name,line_number,character_number);
      std::__cxx11::string::~string((string *)&identifier_name);
      uVar3 = 3;
      break;
    case 3:
      if (SVar2 == COMMA_SYM) {
        uVar3 = 2;
      }
      else {
        if (SVar2 != R_CIRCLE_BRACKET_SYM) {
          return -1;
        }
        uVar3 = 4;
      }
      break;
    case 4:
      return 0;
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode InputStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == SCANF_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == IDENTIFIER_SYM) {
                    string identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    IdentifierCheck(identifier_name, line_number, character_number);
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == COMMA_SYM) {
                    state = 2;
                    break;
                } else if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        handle_correct_queue->NextSymbol();
    }
}